

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moptional.hpp
# Opt level: O0

MoptIterator<int,_int_*> __thiscall mopt::Moptional<int>::end(Moptional<int> *this)

{
  bool bVar1;
  int *piVar2;
  Moptional<int> *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)this);
  if (bVar1) {
    piVar2 = std::optional<int>::operator*(&this->internal_);
    MoptIterator<int,_int_*>::MoptIterator((MoptIterator<int,_int_*> *)&this_local,piVar2 + 1);
  }
  else {
    MoptIterator<int,_int_*>::MoptIterator((MoptIterator<int,_int_*> *)&this_local);
  }
  return (MoptIterator<int,_int_*>)(int *)this_local;
}

Assistant:

decltype(auto) end() {
    if constexpr (details::IsContainerLike<T>()) {
      if (internal_) {
        return MoptIterator<T, typename details::IteratorType<T>::Type>(
            internal_->end());
      } else {
        return MoptIterator<T, typename details::IteratorType<T>::Type>();
      }
    } else {
      if (internal_) {
        // Give a pointer past the memory
        // owned by the internal optional
        return MoptIterator<T, T*>(
            (&*internal_) + 1);
      } else {
        return MoptIterator<T, T*>();
      }
    }
  }